

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.cc
# Opt level: O0

void __thiscall trng::mt19937_64::mt19937_64(mt19937_64 *this,unsigned_long s)

{
  unsigned_long in_RSI;
  mt19937_64 *in_RDI;
  
  status_type::status_type(&in_RDI->S);
  seed(in_RDI,in_RSI);
  return;
}

Assistant:

mt19937_64::mt19937_64(unsigned long s) { seed(s); }